

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O0

void params_enumerate(DHANDLE dhandle,dino_enum_func callback,void *obj)

{
  DHANDLE local_40;
  dino_callback_param_t callback_data;
  dino_http_request_t *request;
  void *obj_local;
  dino_enum_func callback_local;
  DHANDLE dhandle_local;
  
  callback_data.obj = cast_dhandle_request(dhandle);
  if ((dino_http_request_t *)callback_data.obj != (dino_http_request_t *)0x0) {
    memory_clear(&local_40,0x18);
    local_40 = dhandle;
    callback_data.dhandle = callback;
    callback_data.callback = (dino_enum_func)obj;
    dino_strmap_enum(*(str_map_t **)((long)callback_data.obj + 0x20),param_enum,&local_40);
  }
  return;
}

Assistant:

void DINO_EXPORT params_enumerate(DHANDLE dhandle, dino_enum_func callback, const void *obj) {
    dino_http_request_t *request = cast_dhandle_request(dhandle);

    if (NULL != request) {
        dino_callback_param_t callback_data;
        memory_clear(&callback_data, sizeof(dino_callback_param_t));
        callback_data.callback = callback;
        callback_data.dhandle = dhandle;
        callback_data.obj = obj;

        dino_strmap_enum(request->params_map, param_enum, &callback_data);

    }
}